

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::ConsoleAssertionPrinter::print(ConsoleAssertionPrinter *this)

{
  uint64_t uVar1;
  ConsoleAssertionPrinter *this_local;
  
  printSourceInfo(this);
  uVar1 = Counts::total(&(this->stats->totals).assertions);
  if (uVar1 == 0) {
    std::operator<<(this->stream,'\n');
  }
  else {
    printResultType(this);
    printOriginalExpression(this);
    printReconstructedExpression(this);
  }
  printMessage(this);
  return;
}

Assistant:

void print() const {
        printSourceInfo();
        if (stats.totals.assertions.total() > 0) {
            printResultType();
            printOriginalExpression();
            printReconstructedExpression();
        } else {
            stream << '\n';
        }
        printMessage();
    }